

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
adjust_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *freqs,uint32_t largest_sym,
            bool require_u16,uint32_t H_approx)

{
  uint uVar1;
  bool bVar2;
  pointer puVar3;
  uint *puVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  undefined7 in_register_00000009;
  pointer puVar6;
  undefined4 in_register_00000014;
  ulong __n;
  long lVar7;
  size_type __n_00;
  size_type M;
  size_t freqs_sum;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  allocator_type local_99;
  double local_98;
  uint32_t local_8c;
  undefined4 local_88;
  value_type local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mapping;
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  sorted_freqs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  
  local_98 = (double)CONCAT44(in_register_00000014,largest_sym);
  local_88 = (undefined4)CONCAT71(in_register_00000009,require_u16);
  puVar3 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  freqs_sum = 0;
  __n_00 = 0;
  for (lVar7 = 0; (long)puVar6 - (long)puVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    freqs_sum = freqs_sum + puVar3[lVar7];
    __n_00 = (__n_00 + 1) - (ulong)(puVar3[lVar7] == 0);
  }
  M = __n_00;
  if ((int)POPCOUNT(__n_00) != 1) {
    M = 1L << ((ulong)(byte)-(char)LZCOUNT(__n_00) & 0x3f);
    if (__n_00 == 0) {
      M = 1;
    }
  }
  sorted_freqs.
  super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sorted_freqs.
  super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_freqs.
  super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c = H_approx;
  for (mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = (pointer)0x0; auVar10 = in_ZMM1._0_16_,
      mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start < (pointer)((long)puVar6 - (long)puVar3 >> 3);
      mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
    if (puVar3[(long)mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start] != 0) {
      std::
      vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>
      ::emplace_back<unsigned_long_const&,unsigned_long&>
                ((vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>
                  *)&sorted_freqs,
                 puVar3 + (long)mapping.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)&mapping);
      puVar3 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (freqs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_int>*,std::vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sorted_freqs.
             super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             sorted_freqs.
             super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&mapping,__n_00,(allocator_type *)&prev);
  dVar9 = local_98;
  puVar4 = &(sorted_freqs.
             super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second;
  for (lVar7 = 0;
      (long)sorted_freqs.
            super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)sorted_freqs.
            super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 != lVar7; lVar7 = lVar7 + 1) {
    uVar1 = *puVar4;
    puVar4 = puVar4 + 4;
    mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar7] = uVar1;
  }
  dVar8 = entropy<unsigned_long>(freqs,freqs_sum);
  __n = (ulong)(SUB84(dVar9,0) + 1);
  prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,(value_type *)&prev,(allocator_type *)&local_84);
  local_84 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&prev,__n,&local_84,&local_99);
  auVar10 = vcvtusi2sd_avx512f(auVar10,local_8c);
  local_98 = (auVar10._0_8_ / 1000.0 + 1.0) * dVar8;
  do {
    bVar2 = scale_freqs(__return_storage_ptr__,freqs,&mapping,M,__n_00,freqs_sum);
    if (!bVar2) {
      _Var5 = std::
              __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((__return_storage_ptr__->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (__return_storage_ptr__->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
      uVar1 = *_Var5._M_current;
      dVar9 = cross_entropy<unsigned_long,unsigned_int>(freqs,__return_storage_ptr__);
      if (((char)local_88 != '\0') && (0xfffe < uVar1)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (__return_storage_ptr__,&prev);
LAB_001310e4:
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&prev.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&mapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::
        _Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
        ::~_Vector_base(&sorted_freqs.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
                       );
        return __return_storage_ptr__;
      }
      if (dVar9 < local_98) goto LAB_001310e4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&prev,__return_storage_ptr__);
    }
    M = M * 2;
  } while( true );
}

Assistant:

std::vector<uint32_t> adjust_freqs(const std::vector<uint64_t>& freqs,
    uint32_t largest_sym, bool require_u16, uint32_t H_approx = 1)
{
    size_t sigma = 0;
    size_t freq_sum = 0;
    for (size_t i = 0; i < freqs.size(); i++) {
        freq_sum += freqs[i];
        sigma += (freqs[i] != 0);
    }
    size_t target_frame_size = sigma;
    if (!is_power_of_two(target_frame_size)) {
        target_frame_size = next_power_of_two(target_frame_size);
    }

    std::vector<std::pair<uint64_t, uint32_t>> sorted_freqs;
    for (size_t i = 0; i < freqs.size(); i++) {
        if ((freqs[i] != 0))
            sorted_freqs.emplace_back(freqs[i], i);
    }
    std::sort(sorted_freqs.begin(), sorted_freqs.end());
    std::vector<uint32_t> mapping(sigma);
    for (size_t i = 0; i < sorted_freqs.size(); i++)
        mapping[i] = sorted_freqs[i].second;

    auto H = entropy(freqs, freq_sum);
    std::vector<uint32_t> scaled(largest_sym + 1, 0);
    std::vector<uint32_t> prev(largest_sym + 1, 0);
    double approx_factor = 1.0 + double(H_approx) / double(1000);
    double threshold = H * approx_factor;
    uint32_t u16_limit = std::numeric_limits<uint16_t>::max();
    while (true) {
        if (scale_freqs(
                scaled, freqs, mapping, target_frame_size, sigma, freq_sum)) {
            target_frame_size *= 2;
            continue;
        }
        auto max_norm_freq = *std::max_element(scaled.begin(), scaled.end());
        auto XH = cross_entropy(freqs, scaled);

        // we want all freqs to be less than u16::max to have a compact
        // frame representation
        if (require_u16 && max_norm_freq >= u16_limit) {
            // std::cout << "abort due to u16 overflow" << std::endl;
            scaled = prev;
            break;
        }
        // std::cout << "sigma=" << sigma << " m=" << freq_sum << " M=" <<
        // target_frame_size << " H=" << H << " XH=" << XH << " max_freq= " <<
        // max_norm_freq << std::endl;
        if (XH < threshold) {
            break;
        }
        target_frame_size *= 2;
        prev = scaled;
    }

    return scaled;
}